

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::destroy
          (ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *this)

{
  ExceptionOr<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::~ExceptionOr(&this->result);
  ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase(&this->super_ImmediatePromiseNodeBase);
  return;
}

Assistant:

void destroy() override { freePromise(this); }